

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# telnet.c
# Opt level: O2

CURLcode telnet_do(connectdata *conn,_Bool *done)

{
  byte *pbVar1;
  undefined4 *puVar2;
  byte bVar3;
  curl_socket_t sockfd;
  Curl_easy *data;
  Curl_easy *pCVar4;
  int *piVar5;
  ulong uVar6;
  undefined4 *puVar7;
  void *pvVar8;
  undefined8 uVar9;
  undefined4 uVar10;
  ssize_t sVar11;
  int iVar12;
  CURLcode CVar13;
  CURLcode CVar14;
  uint uVar15;
  void *pvVar16;
  curl_slist *pcVar17;
  curl_slist *pcVar18;
  size_t sVar19;
  byte *pbVar20;
  timediff_t tVar21;
  curl_slist **ppcVar22;
  long lVar23;
  ulong uVar24;
  char *pcVar25;
  uint nfds;
  uint uVar26;
  ulong uVar27;
  ulong uVar28;
  bool bVar29;
  curltime cVar30;
  curltime newer;
  curltime older;
  undefined8 *local_1e8;
  long local_1e0;
  int local_1d8;
  long local_1c8;
  ssize_t nread;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  pollfd pfd [2];
  
  data = conn->data;
  sockfd = conn->sock[0];
  pcVar25 = (data->state).buffer;
  *done = true;
  pvVar16 = (*Curl_ccalloc)(1,0x1ed0);
  if (pvVar16 == (void *)0x0) {
    return CURLE_OUT_OF_MEMORY;
  }
  pCVar4 = conn->data;
  (pCVar4->req).protop = pvVar16;
  *(undefined4 *)((long)pvVar16 + 0x1ec8) = 0;
  *(long *)((long)pvVar16 + 0x1eb8) = (long)pvVar16 + 0x1cb8;
  *(undefined4 *)((long)pvVar16 + 0x814) = 1;
  *(undefined4 *)((long)pvVar16 + 0x1414) = 1;
  *(undefined4 *)((long)pvVar16 + 0x808) = 1;
  *(undefined8 *)((long)pvVar16 + 0x1408) = 0x100000001;
  *(undefined4 *)((long)pvVar16 + 0x1884) = 1;
  piVar5 = (int *)(data->req).protop;
  local_148 = 0;
  uStack_140 = 0;
  local_158 = 0;
  uStack_150 = 0;
  local_168 = 0;
  uStack_160 = 0;
  local_178 = 0;
  uStack_170 = 0;
  local_188 = 0;
  uStack_180 = 0;
  local_198 = 0;
  uStack_190 = 0;
  local_1a8 = 0;
  uStack_1a0 = 0;
  nread = 0;
  uStack_1b0 = 0;
  memset(pfd,0,0x100);
  if (((conn->bits).field_0x5 & 1) != 0) {
    curl_msnprintf((char *)pfd,0x100,"USER,%s");
    pcVar17 = curl_slist_append(*(curl_slist **)((long)pvVar16 + 0x1cb0),(char *)pfd);
    if (pcVar17 == (curl_slist *)0x0) {
      CVar13 = CURLE_OUT_OF_MEMORY;
LAB_001202ec:
      local_1e8 = (undefined8 *)((long)pvVar16 + 0x1cb0);
      curl_slist_free_all((curl_slist *)*local_1e8);
      *local_1e8 = 0;
      return CVar13;
    }
    *(curl_slist **)((long)pvVar16 + 0x1cb0) = pcVar17;
    *(undefined4 *)((long)pvVar16 + 0x8a4) = 1;
  }
  ppcVar22 = &(pCVar4->set).telnet_options;
  while (pcVar17 = *ppcVar22, pcVar17 != (curl_slist *)0x0) {
    iVar12 = __isoc99_sscanf(pcVar17->data,"%127[^= ]%*[ =]%255s",&nread);
    if (iVar12 != 2) {
LAB_0011f89b:
      CVar13 = CURLE_TELNET_OPTION_SYNTAX;
      pcVar25 = "Syntax error in telnet option: %s";
LAB_0011f8a6:
      Curl_failf(pCVar4,pcVar25,pcVar17->data);
      goto LAB_001202ec;
    }
    iVar12 = Curl_strcasecompare((char *)&nread,"TTYPE");
    if (iVar12 == 0) {
      iVar12 = Curl_strcasecompare((char *)&nread,"XDISPLOC");
      if (iVar12 == 0) {
        iVar12 = Curl_strcasecompare((char *)&nread,"NEW_ENV");
        if (iVar12 == 0) {
          iVar12 = Curl_strcasecompare((char *)&nread,"WS");
          if (iVar12 == 0) {
            iVar12 = Curl_strcasecompare((char *)&nread,"BINARY");
            if (iVar12 == 0) {
              pcVar25 = "Unknown telnet option %s";
              CVar13 = CURLE_UNKNOWN_OPTION;
              goto LAB_0011f8a6;
            }
            iVar12 = atoi((char *)pfd);
            if (iVar12 != 1) {
              *(undefined4 *)((long)pvVar16 + 0x808) = 0;
              *(undefined4 *)((long)pvVar16 + 0x1408) = 0;
            }
          }
          else {
            iVar12 = __isoc99_sscanf(pfd,"%hu%*[xX]%hu",(long)pvVar16 + 0x1ca8);
            if (iVar12 != 2) goto LAB_0011f89b;
            *(undefined4 *)((long)pvVar16 + 0x884) = 1;
          }
        }
        else {
          pcVar18 = curl_slist_append(*(curl_slist **)((long)pvVar16 + 0x1cb0),(char *)pfd);
          if (pcVar18 == (curl_slist *)0x0) {
            CVar13 = CURLE_OUT_OF_MEMORY;
            goto LAB_001202ec;
          }
          *(curl_slist **)((long)pvVar16 + 0x1cb0) = pcVar18;
          *(undefined4 *)((long)pvVar16 + 0x8a4) = 1;
        }
      }
      else {
        strncpy((char *)((long)pvVar16 + 0x1c28),(char *)pfd,0x7f);
        *(undefined1 *)((long)pvVar16 + 0x1ca7) = 0;
        *(undefined4 *)((long)pvVar16 + 0x894) = 1;
      }
    }
    else {
      strncpy((char *)((long)pvVar16 + 0x1c08),(char *)pfd,0x1f);
      *(undefined1 *)((long)pvVar16 + 0x1c27) = 0;
      *(undefined4 *)((long)pvVar16 + 0x868) = 1;
    }
    ppcVar22 = &pcVar17->next;
  }
  pfd[0].events = 1;
  uVar6 = *(ulong *)&(data->set).field_0x910;
  pfd[0].fd = sockfd;
  if ((uVar6 & 1) == 0) {
    pfd[1].fd = fileno((FILE *)(data->state).in);
    pfd[1].events = 1;
    local_1d8 = 1000;
    nfds = 2;
  }
  else {
    local_1d8 = 100;
    nfds = 1;
  }
  local_1e0 = 0;
  bVar29 = true;
  local_1c8 = 0;
  CVar13 = CURLE_OK;
LAB_0011f8e0:
  if (bVar29) {
    iVar12 = Curl_poll(pfd,nfds,local_1d8);
    if (iVar12 == 0) {
      pfd[0].revents = 0;
      pfd[1].revents = 0;
      goto LAB_0011f959;
    }
    if (iVar12 != -1) {
      if ((pfd[0].revents & 1U) == 0) goto LAB_0011f959;
      CVar13 = Curl_read(conn,sockfd,pcVar25,(data->set).buffer_size,&nread);
      if (CVar13 != CURLE_OK) {
        bVar29 = true;
        if (CVar13 == CURLE_AGAIN) goto LAB_001200ea;
        goto LAB_0011f9c4;
      }
      if (nread < 1) {
        bVar29 = false;
        CVar13 = CURLE_OK;
      }
      else {
        local_1c8 = local_1c8 + nread;
        Curl_pgrsSetDownloadCounter(data,local_1c8);
        sVar11 = nread;
        pCVar4 = conn->data;
        puVar7 = (undefined4 *)(pCVar4->req).protop;
        pbVar1 = (byte *)(puVar7 + 0x7ae);
        puVar2 = puVar7 + 0x72e;
        uVar24 = 0;
        uVar27 = 0xffffffffffffffff;
        while( true ) {
          uVar26 = (uint)uVar27;
          if (sVar11 == uVar24) break;
          uVar15 = uVar26;
          if (8 < (uint)puVar7[0x7b2]) goto LAB_001200c6;
          bVar3 = pcVar25[uVar24];
          uVar28 = (ulong)bVar3;
          switch(puVar7[0x7b2]) {
          case 0:
            if (bVar3 == 0xd) {
              puVar7[0x7b2] = 6;
            }
            else if (bVar3 == 0xff) {
              puVar7[0x7b2] = 1;
              goto LAB_0011fcaa;
            }
LAB_0011ffaa:
            uVar28 = uVar24;
            if (-1 < (int)uVar26) {
              uVar28 = uVar27;
            }
            uVar15 = (uint)uVar28;
            break;
          case 1:
switchD_0011faae_caseD_1:
            switch(bVar3) {
            case 0xfa:
              *(undefined4 **)(puVar7 + 0x7ae) = puVar2;
LAB_0011fe1f:
              puVar7[0x7b2] = 7;
              break;
            case 0xfb:
              puVar7[0x7b2] = 2;
              break;
            case 0xfc:
              puVar7[0x7b2] = 3;
              break;
            case 0xfd:
              puVar7[0x7b2] = 4;
              break;
            case 0xfe:
              puVar7[0x7b2] = 5;
              break;
            case 0xff:
              puVar7[0x7b2] = 0;
              goto LAB_0011ffaa;
            default:
              puVar7[0x7b2] = 0;
              printoption(pCVar4,"RCVD",0xff,(uint)bVar3);
            }
            break;
          case 2:
            printoption(pCVar4,"RCVD",0xfb,(uint)bVar3);
            *puVar7 = 1;
            pvVar16 = (conn->data->req).protop;
            iVar12 = *(int *)((long)pvVar16 + uVar28 * 4 + 0xc08);
            if (iVar12 == 3) {
              iVar12 = *(int *)((long)pvVar16 + uVar28 * 4 + 0x1008);
              if (iVar12 != 1) goto LAB_0011ff07;
              *(undefined4 *)((long)pvVar16 + uVar28 * 4 + 0xc08) = 1;
LAB_0011fee8:
              *(undefined4 *)((long)pvVar16 + uVar28 * 4 + 0x1008) = 0;
            }
            else if (iVar12 == 2) {
              iVar12 = *(int *)((long)pvVar16 + uVar28 * 4 + 0x1008);
              if (iVar12 == 1) {
                *(undefined4 *)((long)pvVar16 + uVar28 * 4 + 0xc08) = 3;
                *(undefined4 *)((long)pvVar16 + uVar28 * 4 + 0x1008) = 0;
                goto LAB_00120070;
              }
              if (iVar12 == 0) {
                *(undefined4 *)((long)pvVar16 + uVar28 * 4 + 0xc08) = 1;
              }
            }
            else if (iVar12 == 0) {
              if (*(int *)((long)pvVar16 + uVar28 * 4 + 0x1408) == 1) {
                *(undefined4 *)((long)pvVar16 + uVar28 * 4 + 0xc08) = 1;
                goto LAB_0012008f;
              }
LAB_00120070:
              iVar12 = 0xfe;
              goto LAB_001200b3;
            }
            goto LAB_001200bb;
          case 3:
            printoption(pCVar4,"RCVD",0xfc,(uint)bVar3);
            *puVar7 = 1;
            pvVar16 = (conn->data->req).protop;
            iVar12 = *(int *)((long)pvVar16 + uVar28 * 4 + 0xc08);
            if (iVar12 == 3) {
              iVar12 = *(int *)((long)pvVar16 + uVar28 * 4 + 0x1008);
              if (iVar12 == 1) {
                *(undefined4 *)((long)pvVar16 + uVar28 * 4 + 0xc08) = 2;
                *(undefined4 *)((long)pvVar16 + uVar28 * 4 + 0x1008) = 0;
LAB_0012008f:
                iVar12 = 0xfd;
                goto LAB_001200b3;
              }
            }
            else {
              if (iVar12 != 2) {
                if (iVar12 == 1) {
                  *(undefined4 *)((long)pvVar16 + uVar28 * 4 + 0xc08) = 0;
                  goto LAB_00120070;
                }
                goto LAB_001200bb;
              }
              iVar12 = *(int *)((long)pvVar16 + uVar28 * 4 + 0x1008);
              if (iVar12 == 1) {
                *(undefined4 *)((long)pvVar16 + uVar28 * 4 + 0xc08) = 0;
                goto LAB_0011fee8;
              }
            }
LAB_0011ff07:
            if (iVar12 == 0) {
              *(undefined4 *)((long)pvVar16 + uVar28 * 4 + 0xc08) = 0;
            }
            goto LAB_001200bb;
          case 4:
            printoption(pCVar4,"RCVD",0xfd,(uint)bVar3);
            *puVar7 = 1;
            pvVar16 = (conn->data->req).protop;
            iVar12 = *(int *)((long)pvVar16 + uVar28 * 4 + 8);
            if (iVar12 == 3) {
              iVar12 = *(int *)((long)pvVar16 + uVar28 * 4 + 0x408);
              if (iVar12 == 1) {
                *(undefined4 *)((long)pvVar16 + uVar28 * 4 + 8) = 1;
                *(undefined4 *)((long)pvVar16 + uVar28 * 4 + 0x408) = 0;
              }
              else if (iVar12 == 0) {
                *(undefined4 *)((long)pvVar16 + uVar28 * 4 + 8) = 0;
              }
            }
            else if (iVar12 == 2) {
              iVar12 = *(int *)((long)pvVar16 + uVar28 * 4 + 0x408);
              if (iVar12 == 1) {
                *(undefined4 *)((long)pvVar16 + uVar28 * 4 + 8) = 3;
                *(undefined4 *)((long)pvVar16 + uVar28 * 4 + 0x1008) = 0;
LAB_00120025:
                send_negotiation(conn,0xfc,(uint)bVar3);
              }
              else if (iVar12 == 0) {
                *(undefined4 *)((long)pvVar16 + uVar28 * 4 + 8) = 1;
                goto LAB_0011fe51;
              }
            }
            else if (iVar12 == 0) {
              if (*(int *)((long)pvVar16 + uVar28 * 4 + 0x808) == 1) {
                *(undefined4 *)((long)pvVar16 + uVar28 * 4 + 8) = 1;
                send_negotiation(conn,0xfb,(uint)bVar3);
LAB_0011fe51:
                if (*(int *)((long)pvVar16 + uVar28 * 4 + 0x1808) != 1) goto LAB_0012004a;
              }
              else {
                if (*(int *)((long)pvVar16 + uVar28 * 4 + 0x1808) != 1) goto LAB_00120025;
                *(undefined4 *)((long)pvVar16 + uVar28 * 4 + 8) = 1;
                send_negotiation(conn,0xfb,(uint)bVar3);
              }
              sendsuboption(conn,(uint)bVar3);
            }
LAB_0012004a:
            puVar7[0x7b2] = 0;
            break;
          case 5:
            printoption(pCVar4,"RCVD",0xfe,(uint)bVar3);
            *puVar7 = 1;
            pvVar16 = (conn->data->req).protop;
            iVar12 = *(int *)((long)pvVar16 + uVar28 * 4 + 8);
            if (iVar12 == 3) {
              iVar12 = *(int *)((long)pvVar16 + uVar28 * 4 + 0x408);
              if (iVar12 == 1) {
                *(undefined4 *)((long)pvVar16 + uVar28 * 4 + 8) = 2;
                *(undefined4 *)((long)pvVar16 + uVar28 * 4 + 0x408) = 0;
                iVar12 = 0xfb;
LAB_001200b3:
                send_negotiation(conn,iVar12,(uint)bVar3);
              }
              else {
LAB_0011ff4f:
                if (iVar12 == 0) {
                  *(undefined4 *)((long)pvVar16 + uVar28 * 4 + 8) = 0;
                }
              }
            }
            else if (iVar12 == 2) {
              iVar12 = *(int *)((long)pvVar16 + uVar28 * 4 + 0x408);
              if (iVar12 != 1) goto LAB_0011ff4f;
              *(undefined4 *)((long)pvVar16 + uVar28 * 4 + 8) = 0;
              *(undefined4 *)((long)pvVar16 + uVar28 * 4 + 0x408) = 0;
            }
            else if (iVar12 == 1) {
              *(undefined4 *)((long)pvVar16 + uVar28 * 4 + 8) = 0;
              iVar12 = 0xfc;
              goto LAB_001200b3;
            }
            goto LAB_001200bb;
          case 6:
            puVar7[0x7b2] = 0;
            if (bVar3 != 0) goto LAB_0011ffaa;
LAB_0011fcaa:
            uVar15 = 0xffffffff;
            if (-1 < (int)uVar26) {
              CVar13 = Curl_client_write(conn,1,pcVar25 + (uVar27 & 0xffffffff),
                                         (long)(int)((int)uVar24 - uVar26));
              uVar15 = 0xffffffff;
              if (CVar13 != CURLE_OK) goto LAB_0012016b;
            }
            break;
          case 7:
            if (bVar3 == 0xff) {
              puVar7[0x7b2] = 8;
            }
            else {
              pbVar20 = *(byte **)pbVar1;
              if (pbVar20 < pbVar1) {
                *(byte **)pbVar1 = pbVar20 + 1;
                *pbVar20 = bVar3;
              }
            }
            break;
          case 8:
            pbVar20 = *(byte **)pbVar1;
            if (bVar3 != 0xf0) {
              if (bVar3 != 0xff) {
                if (pbVar20 < pbVar1) {
                  *(byte **)pbVar1 = pbVar20 + 1;
                  *pbVar20 = 0xff;
                  pbVar20 = *(byte **)pbVar1;
                }
                if (pbVar20 < pbVar1) {
                  *(byte **)pbVar1 = pbVar20 + 1;
                  *pbVar20 = bVar3;
                  pbVar20 = *(byte **)pbVar1;
                }
                *(byte **)(puVar7 + 0x7b0) = pbVar20 + -2;
                *(undefined4 **)(puVar7 + 0x7ae) = puVar2;
                printoption(pCVar4,"In SUBOPTION processing, RCVD",0xff,(uint)bVar3);
                suboption(conn);
                puVar7[0x7b2] = 1;
                goto switchD_0011faae_caseD_1;
              }
              if (pbVar20 < pbVar1) {
                *(byte **)pbVar1 = pbVar20 + 1;
                *pbVar20 = 0xff;
              }
              goto LAB_0011fe1f;
            }
            if (pbVar20 < pbVar1) {
              *(byte **)pbVar1 = pbVar20 + 1;
              *pbVar20 = 0xff;
              pbVar20 = *(byte **)pbVar1;
            }
            if (pbVar20 < pbVar1) {
              *(byte **)pbVar1 = pbVar20 + 1;
              *pbVar20 = 0xf0;
              pbVar20 = *(byte **)pbVar1;
            }
            *(byte **)(puVar7 + 0x7b0) = pbVar20 + -2;
            *(undefined4 **)(puVar7 + 0x7ae) = puVar2;
            suboption(conn);
LAB_001200bb:
            puVar7[0x7b2] = 0;
          }
LAB_001200c6:
          uVar24 = uVar24 + 1;
          uVar27 = (ulong)uVar15;
        }
        if (((int)uVar26 < 0) ||
           (CVar13 = Curl_client_write(conn,1,pcVar25 + (uVar27 & 0xffffffff),
                                       (long)(int)((int)sVar11 - uVar26)), CVar13 == CURLE_OK)) {
          CVar13 = CURLE_OK;
          if ((*piVar5 != 0) && (piVar5[1] == 0)) {
            pvVar16 = (conn->data->req).protop;
            lVar23 = 0;
            do {
              if (lVar23 != 1) {
                if (lVar23 == 0x28) goto LAB_001202c7;
                if (*(int *)((long)pvVar16 + lVar23 * 4 + 0x808) == 1) {
                  pvVar8 = (conn->data->req).protop;
                  iVar12 = *(int *)((long)pvVar8 + lVar23 * 4 + 8);
                  if (iVar12 == 3) {
                    if (*(int *)((long)pvVar8 + lVar23 * 4 + 0x408) == 0) {
                      *(undefined4 *)((long)pvVar8 + lVar23 * 4 + 0x408) = 1;
                    }
                  }
                  else if (iVar12 == 2) {
                    if (*(int *)((long)pvVar8 + lVar23 * 4 + 0x408) == 1) {
                      *(undefined4 *)((long)pvVar8 + lVar23 * 4 + 0x408) = 0;
                    }
                  }
                  else if (iVar12 == 0) {
                    *(undefined4 *)((long)pvVar8 + lVar23 * 4 + 8) = 2;
                    send_negotiation(conn,0xfb,(int)lVar23);
                  }
                }
                if (*(int *)((long)pvVar16 + lVar23 * 4 + 0x1408) == 1) {
                  pvVar8 = (conn->data->req).protop;
                  iVar12 = *(int *)((long)pvVar8 + lVar23 * 4 + 0xc08);
                  if (iVar12 == 3) {
                    if (*(int *)((long)pvVar8 + lVar23 * 4 + 0x1008) == 0) {
                      *(undefined4 *)((long)pvVar8 + lVar23 * 4 + 0x1008) = 1;
                    }
                  }
                  else if (iVar12 == 2) {
                    if (*(int *)((long)pvVar8 + lVar23 * 4 + 0x1008) == 1) {
                      *(undefined4 *)((long)pvVar8 + lVar23 * 4 + 0x1008) = 0;
                    }
                  }
                  else if (iVar12 == 0) {
                    *(undefined4 *)((long)pvVar8 + lVar23 * 4 + 0xc08) = 2;
                    send_negotiation(conn,0xfd,(int)lVar23);
                  }
                }
              }
              lVar23 = lVar23 + 1;
            } while( true );
          }
          goto LAB_0011f959;
        }
LAB_0012016b:
        bVar29 = false;
      }
      goto LAB_001200ea;
    }
  }
  goto LAB_00120303;
LAB_001202c7:
  piVar5[1] = 1;
LAB_0011f959:
  nread = 0;
  if ((uVar6 & 1) == 0) {
    if ((pfd[1].revents & 1U) != 0) {
      nread = read(pfd[1].fd,pcVar25,(data->set).buffer_size);
LAB_0011f9eb:
      if (0 < nread) {
        CVar14 = send_telnet_data(conn,pcVar25,nread);
        CVar13 = CURLE_OK;
        if (CVar14 != CURLE_OK) {
          bVar29 = false;
          CVar13 = CVar14;
          goto LAB_001200ea;
        }
        local_1e0 = local_1e0 + nread;
        Curl_pgrsSetUploadCounter(data,local_1e0);
        goto LAB_001200e8;
      }
    }
    bVar29 = nread == 0;
  }
  else {
    sVar19 = (*(data->state).fread_func)(pcVar25,1,(data->set).buffer_size,(data->state).in);
    nread = (ssize_t)(int)sVar19;
    if (sVar19 << 0x20 == 0x1000000000000000) {
LAB_0011f9c4:
      bVar29 = false;
      goto LAB_001200ea;
    }
    if (sVar19 << 0x20 != 0x1000000100000000) goto LAB_0011f9eb;
LAB_001200e8:
    bVar29 = true;
  }
LAB_001200ea:
  if ((data->set).timeout != 0) {
    cVar30 = Curl_now();
    uVar9 = (conn->created).tv_sec;
    uVar10 = (conn->created).tv_usec;
    older.tv_usec = uVar10;
    older.tv_sec = uVar9;
    newer._12_4_ = 0;
    newer.tv_sec = SUB128(cVar30._0_12_,0);
    newer.tv_usec = SUB124(cVar30._0_12_,8);
    older._12_4_ = 0;
    tVar21 = Curl_timediff(newer,older);
    if ((data->set).timeout <= tVar21) {
      bVar29 = false;
      Curl_failf(data,"Time-out");
      CVar13 = CURLE_OPERATION_TIMEDOUT;
    }
  }
  iVar12 = Curl_pgrsUpdate(conn);
  if (iVar12 != 0) {
    CVar13 = CURLE_ABORTED_BY_CALLBACK;
LAB_00120303:
    Curl_setup_transfer(data,-1,-1,false,-1);
    return CVar13;
  }
  goto LAB_0011f8e0;
}

Assistant:

static CURLcode telnet_do(struct connectdata *conn, bool *done)
{
  CURLcode result;
  struct Curl_easy *data = conn->data;
  curl_socket_t sockfd = conn->sock[FIRSTSOCKET];
#ifdef USE_WINSOCK
  HMODULE wsock2;
  WSOCK2_FUNC close_event_func;
  WSOCK2_EVENT create_event_func;
  WSOCK2_FUNC event_select_func;
  WSOCK2_FUNC enum_netevents_func;
  WSAEVENT event_handle;
  WSANETWORKEVENTS events;
  HANDLE stdin_handle;
  HANDLE objs[2];
  DWORD  obj_count;
  DWORD  wait_timeout;
  DWORD readfile_read;
  int err;
#else
  int interval_ms;
  struct pollfd pfd[2];
  int poll_cnt;
  curl_off_t total_dl = 0;
  curl_off_t total_ul = 0;
#endif
  ssize_t nread;
  struct curltime now;
  bool keepon = TRUE;
  char *buf = data->state.buffer;
  struct TELNET *tn;

  *done = TRUE; /* unconditionally */

  result = init_telnet(conn);
  if(result)
    return result;

  tn = (struct TELNET *)data->req.protop;

  result = check_telnet_options(conn);
  if(result)
    return result;

#ifdef USE_WINSOCK
  /*
  ** This functionality only works with WinSock >= 2.0.  So,
  ** make sure we have it.
  */
  result = check_wsock2(data);
  if(result)
    return result;

  /* OK, so we have WinSock 2.0.  We need to dynamically */
  /* load ws2_32.dll and get the function pointers we need. */
  wsock2 = Curl_load_library(TEXT("WS2_32.DLL"));
  if(wsock2 == NULL) {
    failf(data, "failed to load WS2_32.DLL (%u)", GetLastError());
    return CURLE_FAILED_INIT;
  }

  /* Grab a pointer to WSACreateEvent */
  create_event_func =
    CURLX_FUNCTION_CAST(WSOCK2_EVENT,
                        (GetProcAddress(wsock2, "WSACreateEvent")));
  if(create_event_func == NULL) {
    failf(data, "failed to find WSACreateEvent function (%u)", GetLastError());
    FreeLibrary(wsock2);
    return CURLE_FAILED_INIT;
  }

  /* And WSACloseEvent */
  close_event_func = GetProcAddress(wsock2, "WSACloseEvent");
  if(close_event_func == NULL) {
    failf(data, "failed to find WSACloseEvent function (%u)", GetLastError());
    FreeLibrary(wsock2);
    return CURLE_FAILED_INIT;
  }

  /* And WSAEventSelect */
  event_select_func = GetProcAddress(wsock2, "WSAEventSelect");
  if(event_select_func == NULL) {
    failf(data, "failed to find WSAEventSelect function (%u)", GetLastError());
    FreeLibrary(wsock2);
    return CURLE_FAILED_INIT;
  }

  /* And WSAEnumNetworkEvents */
  enum_netevents_func = GetProcAddress(wsock2, "WSAEnumNetworkEvents");
  if(enum_netevents_func == NULL) {
    failf(data, "failed to find WSAEnumNetworkEvents function (%u)",
          GetLastError());
    FreeLibrary(wsock2);
    return CURLE_FAILED_INIT;
  }

  /* We want to wait for both stdin and the socket. Since
  ** the select() function in winsock only works on sockets
  ** we have to use the WaitForMultipleObjects() call.
  */

  /* First, create a sockets event object */
  event_handle = (WSAEVENT)create_event_func();
  if(event_handle == WSA_INVALID_EVENT) {
    failf(data, "WSACreateEvent failed (%d)", SOCKERRNO);
    FreeLibrary(wsock2);
    return CURLE_FAILED_INIT;
  }

  /* Tell winsock what events we want to listen to */
  if(event_select_func(sockfd, event_handle, FD_READ|FD_CLOSE) ==
     SOCKET_ERROR) {
    close_event_func(event_handle);
    FreeLibrary(wsock2);
    return CURLE_OK;
  }

  /* The get the Windows file handle for stdin */
  stdin_handle = GetStdHandle(STD_INPUT_HANDLE);

  /* Create the list of objects to wait for */
  objs[0] = event_handle;
  objs[1] = stdin_handle;

  /* If stdin_handle is a pipe, use PeekNamedPipe() method to check it,
     else use the old WaitForMultipleObjects() way */
  if(GetFileType(stdin_handle) == FILE_TYPE_PIPE ||
     data->set.is_fread_set) {
    /* Don't wait for stdin_handle, just wait for event_handle */
    obj_count = 1;
    /* Check stdin_handle per 100 milliseconds */
    wait_timeout = 100;
  }
  else {
    obj_count = 2;
    wait_timeout = 1000;
  }

  /* Keep on listening and act on events */
  while(keepon) {
    const DWORD buf_size = (DWORD)data->set.buffer_size;
    DWORD waitret = WaitForMultipleObjects(obj_count, objs,
                                           FALSE, wait_timeout);
    switch(waitret) {
    case WAIT_TIMEOUT:
    {
      for(;;) {
        if(data->set.is_fread_set) {
          size_t n;
          /* read from user-supplied method */
          n = data->state.fread_func(buf, 1, buf_size, data->state.in);
          if(n == CURL_READFUNC_ABORT) {
            keepon = FALSE;
            result = CURLE_READ_ERROR;
            break;
          }

          if(n == CURL_READFUNC_PAUSE)
            break;

          if(n == 0)                        /* no bytes */
            break;

          /* fall through with number of bytes read */
          readfile_read = (DWORD)n;
        }
        else {
          /* read from stdin */
          if(!PeekNamedPipe(stdin_handle, NULL, 0, NULL,
                            &readfile_read, NULL)) {
            keepon = FALSE;
            result = CURLE_READ_ERROR;
            break;
          }

          if(!readfile_read)
            break;

          if(!ReadFile(stdin_handle, buf, buf_size,
                       &readfile_read, NULL)) {
            keepon = FALSE;
            result = CURLE_READ_ERROR;
            break;
          }
        }

        result = send_telnet_data(conn, buf, readfile_read);
        if(result) {
          keepon = FALSE;
          break;
        }
      }
    }
    break;

    case WAIT_OBJECT_0 + 1:
    {
      if(!ReadFile(stdin_handle, buf, buf_size,
                   &readfile_read, NULL)) {
        keepon = FALSE;
        result = CURLE_READ_ERROR;
        break;
      }

      result = send_telnet_data(conn, buf, readfile_read);
      if(result) {
        keepon = FALSE;
        break;
      }
    }
    break;

    case WAIT_OBJECT_0:

      events.lNetworkEvents = 0;
      if(SOCKET_ERROR == enum_netevents_func(sockfd, event_handle, &events)) {
        err = SOCKERRNO;
        if(err != EINPROGRESS) {
          infof(data, "WSAEnumNetworkEvents failed (%d)", err);
          keepon = FALSE;
          result = CURLE_READ_ERROR;
        }
        break;
      }
      if(events.lNetworkEvents & FD_READ) {
        /* read data from network */
        result = Curl_read(conn, sockfd, buf, data->set.buffer_size, &nread);
        /* read would've blocked. Loop again */
        if(result == CURLE_AGAIN)
          break;
        /* returned not-zero, this an error */
        else if(result) {
          keepon = FALSE;
          break;
        }
        /* returned zero but actually received 0 or less here,
           the server closed the connection and we bail out */
        else if(nread <= 0) {
          keepon = FALSE;
          break;
        }

        result = telrcv(conn, (unsigned char *) buf, nread);
        if(result) {
          keepon = FALSE;
          break;
        }

        /* Negotiate if the peer has started negotiating,
           otherwise don't. We don't want to speak telnet with
           non-telnet servers, like POP or SMTP. */
        if(tn->please_negotiate && !tn->already_negotiated) {
          negotiate(conn);
          tn->already_negotiated = 1;
        }
      }
      if(events.lNetworkEvents & FD_CLOSE) {
        keepon = FALSE;
      }
      break;

    }

    if(data->set.timeout) {
      now = Curl_now();
      if(Curl_timediff(now, conn->created) >= data->set.timeout) {
        failf(data, "Time-out");
        result = CURLE_OPERATION_TIMEDOUT;
        keepon = FALSE;
      }
    }
  }

  /* We called WSACreateEvent, so call WSACloseEvent */
  if(!close_event_func(event_handle)) {
    infof(data, "WSACloseEvent failed (%d)", SOCKERRNO);
  }

  /* "Forget" pointers into the library we're about to free */
  create_event_func = NULL;
  close_event_func = NULL;
  event_select_func = NULL;
  enum_netevents_func = NULL;

  /* We called LoadLibrary, so call FreeLibrary */
  if(!FreeLibrary(wsock2))
    infof(data, "FreeLibrary(wsock2) failed (%u)", GetLastError());
#else
  pfd[0].fd = sockfd;
  pfd[0].events = POLLIN;

  if(data->set.is_fread_set) {
    poll_cnt = 1;
    interval_ms = 100; /* poll user-supplied read function */
  }
  else {
    /* really using fread, so infile is a FILE* */
    pfd[1].fd = fileno((FILE *)data->state.in);
    pfd[1].events = POLLIN;
    poll_cnt = 2;
    interval_ms = 1 * 1000;
  }

  while(keepon) {
    switch(Curl_poll(pfd, poll_cnt, interval_ms)) {
    case -1:                    /* error, stop reading */
      keepon = FALSE;
      continue;
    case 0:                     /* timeout */
      pfd[0].revents = 0;
      pfd[1].revents = 0;
      /* FALLTHROUGH */
    default:                    /* read! */
      if(pfd[0].revents & POLLIN) {
        /* read data from network */
        result = Curl_read(conn, sockfd, buf, data->set.buffer_size, &nread);
        /* read would've blocked. Loop again */
        if(result == CURLE_AGAIN)
          break;
        /* returned not-zero, this an error */
        if(result) {
          keepon = FALSE;
          break;
        }
        /* returned zero but actually received 0 or less here,
           the server closed the connection and we bail out */
        else if(nread <= 0) {
          keepon = FALSE;
          break;
        }

        total_dl += nread;
        Curl_pgrsSetDownloadCounter(data, total_dl);
        result = telrcv(conn, (unsigned char *)buf, nread);
        if(result) {
          keepon = FALSE;
          break;
        }

        /* Negotiate if the peer has started negotiating,
           otherwise don't. We don't want to speak telnet with
           non-telnet servers, like POP or SMTP. */
        if(tn->please_negotiate && !tn->already_negotiated) {
          negotiate(conn);
          tn->already_negotiated = 1;
        }
      }

      nread = 0;
      if(poll_cnt == 2) {
        if(pfd[1].revents & POLLIN) { /* read from in file */
          nread = read(pfd[1].fd, buf, data->set.buffer_size);
        }
      }
      else {
        /* read from user-supplied method */
        nread = (int)data->state.fread_func(buf, 1, data->set.buffer_size,
                                            data->state.in);
        if(nread == CURL_READFUNC_ABORT) {
          keepon = FALSE;
          break;
        }
        if(nread == CURL_READFUNC_PAUSE)
          break;
      }

      if(nread > 0) {
        result = send_telnet_data(conn, buf, nread);
        if(result) {
          keepon = FALSE;
          break;
        }
        total_ul += nread;
        Curl_pgrsSetUploadCounter(data, total_ul);
      }
      else if(nread < 0)
        keepon = FALSE;

      break;
    } /* poll switch statement */

    if(data->set.timeout) {
      now = Curl_now();
      if(Curl_timediff(now, conn->created) >= data->set.timeout) {
        failf(data, "Time-out");
        result = CURLE_OPERATION_TIMEDOUT;
        keepon = FALSE;
      }
    }

    if(Curl_pgrsUpdate(conn)) {
      result = CURLE_ABORTED_BY_CALLBACK;
      break;
    }
  }
#endif
  /* mark this as "no further transfer wanted" */
  Curl_setup_transfer(data, -1, -1, FALSE, -1);

  return result;
}